

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void update_buffer_level(AV1_COMP *cpi,int encoded_frame_size)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  SVC *unaff_retaddr;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  long local_38;
  undefined8 local_30;
  
  lVar1 = *in_RDI;
  if ((int)in_RDI[0x782c] == 0) {
    *(long *)(lVar1 + 0xad58) = *(long *)(lVar1 + 0xad58) - (long)in_ESI;
  }
  else {
    *(long *)(lVar1 + 0xad58) =
         (long)(*(int *)((long)in_RDI + 0x607f4) - in_ESI) + *(long *)(lVar1 + 0xad58);
  }
  if (*(long *)(lVar1 + 0xad58) < *(long *)(lVar1 + 0xac80)) {
    local_30 = *(undefined8 *)(lVar1 + 0xad58);
  }
  else {
    local_30 = *(undefined8 *)(lVar1 + 0xac80);
  }
  *(undefined8 *)(lVar1 + 0xad58) = local_30;
  if (*(int *)((long)in_RDI + 0x4269c) == 1) {
    if (-*(long *)(lVar1 + 0xac80) < *(long *)(lVar1 + 0xad58)) {
      local_38 = *(long *)(lVar1 + 0xad58);
    }
    else {
      local_38 = -*(long *)(lVar1 + 0xac80);
    }
    *(long *)(lVar1 + 0xad58) = local_38;
  }
  *(undefined8 *)(lVar1 + 0xad38) = *(undefined8 *)(lVar1 + 0xad58);
  if (*(int *)(*in_RDI + 0xc750) != 0) {
    update_layer_buffer_level
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  }
  return;
}

Assistant:

static void update_buffer_level(AV1_COMP *cpi, int encoded_frame_size) {
  const AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;

  // Non-viewable frames are a special case and are treated as pure overhead.
  if (!cm->show_frame)
    p_rc->bits_off_target -= encoded_frame_size;
  else
    p_rc->bits_off_target += rc->avg_frame_bandwidth - encoded_frame_size;

  // Clip the buffer level to the maximum specified buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  // For screen-content mode: don't let buffer level go below threshold,
  // given here as -rc->maximum_ buffer_size, to allow buffer to come back
  // up sooner after slide change with big overshoot.
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN)
    p_rc->bits_off_target =
        AOMMAX(p_rc->bits_off_target, -p_rc->maximum_buffer_size);
  p_rc->buffer_level = p_rc->bits_off_target;

  if (cpi->ppi->use_svc)
    update_layer_buffer_level(&cpi->svc, encoded_frame_size,
                              cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);

#if CONFIG_FPMT_TEST
  /* The variable temp_buffer_level is introduced for quality
   * simulation purpose, it retains the value previous to the parallel
   * encode frames. The variable is updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    p_rc->temp_buffer_level = p_rc->buffer_level;
  }
#endif
}